

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::sprint(VM *this)

{
  char_t cVar1;
  int local_14;
  char_t ch;
  int_t str;
  VM *this_local;
  
  local_14 = POP<int>(this);
  while( true ) {
    cVar1 = READ<unsigned_char>(this,local_14);
    if (cVar1 == '\0') break;
    std::operator<<((ostream *)&std::cout,cVar1);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void VM::sprint() {
    auto str = POP<addr_t>();
    // std::cout << reinterpret_cast<const char*>(str);
    char_t ch;
    while ((ch = READ<char_t>(str++)) != '\0') {
        std::cout << ch;
    }
}